

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_iterator.hpp
# Opt level: O0

void __thiscall
burst::
intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
::faze(intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
       *this)

{
  type_conflict4 tVar1;
  bool bVar2;
  pointer this_00;
  iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
  *piVar3;
  reference __t;
  reference __u;
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  local_98;
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  local_80;
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  local_68;
  int local_50;
  undefined1 local_40 [8];
  outer_range_iterator range;
  outer_range_iterator max_range;
  intersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_std::greater<void>_>
  *this_local;
  
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  ::owning_iterator((owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
                     *)&range.m_iterator,&this->m_begin);
  owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
  ::owning_iterator((owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
                     *)local_40,&this->m_begin);
  do {
    tVar1 = boost::iterators::operator!=
                      ((iterator_facade<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long>
                        *)local_40,
                       (iterator_facade<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long>
                        *)&this->m_end);
    if (!tVar1) {
      local_50 = 2;
LAB_003fd934:
      owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
      ::~owning_iterator((owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
                          *)local_40);
      if (local_50 == 2) {
        owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
        ::owning_iterator(&local_68,
                          (owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
                           *)&range.m_iterator);
        owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
        ::owning_iterator(&local_98,&this->m_end);
        std::
        prev<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>>,std::allocator<boost::iterator_range<std::_List_const_iterator<int>>>>>>
                  (&local_80,&local_98,1);
        std::
        iter_swap<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>>,std::allocator<boost::iterator_range<std::_List_const_iterator<int>>>>>,burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>>,std::allocator<boost::iterator_range<std::_List_const_iterator<int>>>>>>
                  (&local_68,&local_80);
        owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
        ::~owning_iterator(&local_80);
        owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
        ::~owning_iterator(&local_98);
        owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
        ::~owning_iterator(&local_68);
        local_50 = 0;
      }
      owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
      ::~owning_iterator((owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
                          *)&range.m_iterator);
      return;
    }
    this_00 = boost::iterators::detail::
              iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
              ::operator->((iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
                            *)local_40);
    boost::iterator_range<std::_List_const_iterator<int>_>::advance_begin(this_00,1);
    piVar3 = (iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
              *)boost::iterators::detail::
                iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
                ::operator->((iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
                              *)local_40);
    bVar2 = boost::iterator_range_detail::
            iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
            ::empty(piVar3);
    if (bVar2) {
      scroll_to_end(this);
      local_50 = 1;
      goto LAB_003fd934;
    }
    piVar3 = (iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
              *)boost::iterators::detail::
                iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
                ::operator->((iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
                              *)&range.m_iterator);
    __t = boost::iterator_range_detail::
          iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          ::front(piVar3);
    piVar3 = (iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
              *)boost::iterators::detail::
                iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
                ::operator->((iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
                              *)local_40);
    __u = boost::iterator_range_detail::
          iterator_range_base<std::_List_const_iterator<int>,_boost::iterators::incrementable_traversal_tag>
          ::front(piVar3);
    bVar2 = std::greater<void>::operator()((greater<void> *)&this->field_0x30,__t,__u);
    if (bVar2) {
      owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
      ::operator=((owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
                   *)&range.m_iterator,
                  (owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>
                   *)local_40);
    }
    boost::iterators::detail::
    iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
    ::operator++((iterator_facade_base<burst::owning_iterator<std::vector<boost::iterator_range<std::_List_const_iterator<int>_>,_std::allocator<boost::iterator_range<std::_List_const_iterator<int>_>_>_>_>,_boost::iterator_range<std::_List_const_iterator<int>_>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<std::_List_const_iterator<int>_>_&,_long,_false,_false>
                  *)local_40);
  } while( true );
}

Assistant:

void faze ()
        {
            auto max_range = m_begin;
            for (auto range = m_begin; range != m_end; ++range)
            {
                range->advance_begin(1);
                if (range->empty())
                {
                    scroll_to_end();
                    return;
                }
                else if (m_compare(max_range->front(), range->front()))
                {
                    max_range = range;
                }
            }
            std::iter_swap(max_range, std::prev(m_end));
        }